

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files_test.c
# Opt level: O2

void test_file_contents(void)

{
  nng_err num;
  int iVar1;
  char *pcVar2;
  undefined1 auStack_68 [8];
  scratch s;
  char *local_30;
  void *data;
  size_t len;
  
  s.b = (char *)0x0;
  s.c = (char *)0x0;
  s.mydir = (char *)0x0;
  s.a = (char *)0x0;
  auStack_68 = (undefined1  [8])0x0;
  s.temp = (char *)0x0;
  make_scratch((scratch *)auStack_68);
  num = nni_file_get(s.mydir,&local_30,(size_t *)&data);
  pcVar2 = nng_strerror(num);
  iVar1 = acutest_check_((uint)(num == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                         ,0xf1,"%s: expected success, got %s (%d)","nni_file_get(s.a, &data, &len)",
                         pcVar2,num);
  if (iVar1 != 0) {
    acutest_check_((uint)(data == (void *)0x6),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                   ,0xf2,"%s","len == 6");
    pcVar2 = local_30;
    iVar1 = strcmp(local_30,"alpha");
    acutest_check_((uint)(iVar1 == 0),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                   ,0xf3,"%s == %s",pcVar2,"alpha",num);
    nni_free(local_30,(size_t)data);
    clean_scratch((scratch *)auStack_68);
    return;
  }
  acutest_abort_();
}

Assistant:

static void
test_file_contents(void)
{
	void          *data;
	size_t         len;
	struct scratch s = { 0 };

	make_scratch(&s);

	NUTS_PASS(nni_file_get(s.a, &data, &len));
	NUTS_TRUE(len == 6);
	NUTS_MATCH(data, "alpha");
	nni_free(data, len);
	clean_scratch(&s);
}